

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverApi.c
# Opt level: O0

void Msat_SolverResize(Msat_Solver_t *p,int nVarsAlloc)

{
  int iVar1;
  Msat_ClauseVec_t *pMVar2;
  Msat_Queue_t *pMVar3;
  Msat_IntVec_t *Entry;
  int *local_60;
  int *local_58;
  Msat_Clause_t **local_50;
  Msat_ClauseVec_t **local_48;
  int *local_40;
  int *local_38;
  float *local_30;
  double *local_28;
  int local_1c;
  int i;
  int nVarsAllocOld;
  int nVarsAlloc_local;
  Msat_Solver_t *p_local;
  
  iVar1 = p->nVarsAlloc;
  p->nVarsAlloc = nVarsAlloc;
  if (p->pdActivity == (double *)0x0) {
    local_28 = (double *)malloc((long)p->nVarsAlloc << 3);
  }
  else {
    local_28 = (double *)realloc(p->pdActivity,(long)p->nVarsAlloc << 3);
  }
  p->pdActivity = local_28;
  if (p->pFactors == (float *)0x0) {
    local_30 = (float *)malloc((long)p->nVarsAlloc << 2);
  }
  else {
    local_30 = (float *)realloc(p->pFactors,(long)p->nVarsAlloc << 2);
  }
  p->pFactors = local_30;
  for (local_1c = iVar1; local_1c < p->nVarsAlloc; local_1c = local_1c + 1) {
    p->pdActivity[local_1c] = 0.0;
    p->pFactors[local_1c] = 1.0;
  }
  if (p->pAssigns == (int *)0x0) {
    local_38 = (int *)malloc((long)p->nVarsAlloc << 2);
  }
  else {
    local_38 = (int *)realloc(p->pAssigns,(long)p->nVarsAlloc << 2);
  }
  p->pAssigns = local_38;
  if (p->pModel == (int *)0x0) {
    local_40 = (int *)malloc((long)p->nVarsAlloc << 2);
  }
  else {
    local_40 = (int *)realloc(p->pModel,(long)p->nVarsAlloc << 2);
  }
  p->pModel = local_40;
  for (local_1c = iVar1; local_1c < p->nVarsAlloc; local_1c = local_1c + 1) {
    p->pAssigns[local_1c] = -1;
  }
  Msat_OrderSetBounds(p->pOrder,p->nVarsAlloc);
  if (p->pvWatched == (Msat_ClauseVec_t **)0x0) {
    local_48 = (Msat_ClauseVec_t **)malloc((long)(p->nVarsAlloc << 1) << 3);
  }
  else {
    local_48 = (Msat_ClauseVec_t **)realloc(p->pvWatched,(long)(p->nVarsAlloc << 1) << 3);
  }
  p->pvWatched = local_48;
  for (local_1c = iVar1 << 1;
      SBORROW4(local_1c,p->nVarsAlloc * 2) != local_1c + p->nVarsAlloc * -2 < 0;
      local_1c = local_1c + 1) {
    pMVar2 = Msat_ClauseVecAlloc(0x10);
    p->pvWatched[local_1c] = pMVar2;
  }
  Msat_QueueFree(p->pQueue);
  pMVar3 = Msat_QueueAlloc(p->nVarsAlloc);
  p->pQueue = pMVar3;
  if (p->pReasons == (Msat_Clause_t **)0x0) {
    local_50 = (Msat_Clause_t **)malloc((long)p->nVarsAlloc << 3);
  }
  else {
    local_50 = (Msat_Clause_t **)realloc(p->pReasons,(long)p->nVarsAlloc << 3);
  }
  p->pReasons = local_50;
  if (p->pLevel == (int *)0x0) {
    local_58 = (int *)malloc((long)p->nVarsAlloc << 2);
  }
  else {
    local_58 = (int *)realloc(p->pLevel,(long)p->nVarsAlloc << 2);
  }
  p->pLevel = local_58;
  for (local_1c = iVar1; local_1c < p->nVarsAlloc; local_1c = local_1c + 1) {
    p->pReasons[local_1c] = (Msat_Clause_t *)0x0;
    p->pLevel[local_1c] = -1;
  }
  if (p->pSeen == (int *)0x0) {
    local_60 = (int *)malloc((long)p->nVarsAlloc << 2);
  }
  else {
    local_60 = (int *)realloc(p->pSeen,(long)p->nVarsAlloc << 2);
  }
  p->pSeen = local_60;
  for (local_1c = iVar1; local_1c < p->nVarsAlloc; local_1c = local_1c + 1) {
    p->pSeen[local_1c] = 0;
  }
  Msat_IntVecGrow(p->vTrail,p->nVarsAlloc);
  Msat_IntVecGrow(p->vTrailLim,p->nVarsAlloc);
  for (local_1c = Msat_ClauseVecReadSize(p->vAdjacents); local_1c < p->nVarsAlloc;
      local_1c = local_1c + 1) {
    pMVar2 = p->vAdjacents;
    Entry = Msat_IntVecAlloc(5);
    Msat_ClauseVecPush(pMVar2,(Msat_Clause_t *)Entry);
  }
  Msat_IntVecFill(p->vVarsUsed,p->nVarsAlloc,1);
  return;
}

Assistant:

void Msat_SolverResize( Msat_Solver_t * p, int nVarsAlloc )
{
    int nVarsAllocOld, i;

    nVarsAllocOld = p->nVarsAlloc;
    p->nVarsAlloc = nVarsAlloc;

    p->pdActivity = ABC_REALLOC( double, p->pdActivity, p->nVarsAlloc );
    p->pFactors   = ABC_REALLOC( float, p->pFactors, p->nVarsAlloc );
    for ( i = nVarsAllocOld; i < p->nVarsAlloc; i++ )
    {
        p->pdActivity[i] = 0.0;
        p->pFactors[i]   = 1.0;
    }

    p->pAssigns  = ABC_REALLOC( int, p->pAssigns, p->nVarsAlloc );
    p->pModel    = ABC_REALLOC( int, p->pModel, p->nVarsAlloc );
    for ( i = nVarsAllocOld; i < p->nVarsAlloc; i++ )
        p->pAssigns[i] = MSAT_VAR_UNASSIGNED;

//    Msat_OrderRealloc( p->pOrder, p->pAssigns, p->pdActivity, p->nVarsAlloc );
    Msat_OrderSetBounds( p->pOrder, p->nVarsAlloc );

    p->pvWatched = ABC_REALLOC( Msat_ClauseVec_t *, p->pvWatched, 2 * p->nVarsAlloc );
    for ( i = 2 * nVarsAllocOld; i < 2 * p->nVarsAlloc; i++ )
        p->pvWatched[i] = Msat_ClauseVecAlloc( 16 );

    Msat_QueueFree( p->pQueue );
    p->pQueue    = Msat_QueueAlloc( p->nVarsAlloc );

    p->pReasons  = ABC_REALLOC( Msat_Clause_t *, p->pReasons, p->nVarsAlloc );
    p->pLevel    = ABC_REALLOC( int, p->pLevel, p->nVarsAlloc );
    for ( i = nVarsAllocOld; i < p->nVarsAlloc; i++ )
    {
        p->pReasons[i] = NULL;
        p->pLevel[i] = -1;
    }

    p->pSeen     = ABC_REALLOC( int, p->pSeen, p->nVarsAlloc );
    for ( i = nVarsAllocOld; i < p->nVarsAlloc; i++ )
        p->pSeen[i] = 0;

    Msat_IntVecGrow( p->vTrail, p->nVarsAlloc );
    Msat_IntVecGrow( p->vTrailLim, p->nVarsAlloc );

    // make sure the array of adjucents has room to store the variable numbers
    for ( i = Msat_ClauseVecReadSize(p->vAdjacents); i < p->nVarsAlloc; i++ )
        Msat_ClauseVecPush( p->vAdjacents, (Msat_Clause_t *)Msat_IntVecAlloc(5) );
    Msat_IntVecFill( p->vVarsUsed, p->nVarsAlloc, 1 );
}